

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O2

ostream * Libdbc::operator<<(ostream *out,Signal *sig)

{
  pointer pbVar1;
  ostream *poVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *reciever;
  pointer pbVar4;
  
  poVar2 = std::operator<<(out,"Signal {name: ");
  poVar2 = std::operator<<(poVar2,(string *)&sig->name);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(out,"Multiplexed: ");
  pcVar3 = "False";
  if (sig->is_multiplexed != false) {
    pcVar3 = "True";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(out,"Start bit: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(out,"Size: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(out,"Endianness: ");
  pcVar3 = "Little endian";
  if (sig->is_bigendian != false) {
    pcVar3 = "Big endian";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(out,"Value Type: ");
  pcVar3 = "Unsigned";
  if (sig->is_signed != false) {
    pcVar3 = "Signed";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,", ");
  std::operator<<(out,"Min: ");
  poVar2 = std::ostream::_M_insert<double>(sig->min);
  std::operator<<(poVar2,", Max: ");
  poVar2 = std::ostream::_M_insert<double>(sig->max);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(out,"Unit: (");
  poVar2 = std::operator<<(poVar2,(string *)&sig->unit);
  std::operator<<(poVar2,"), ");
  std::operator<<(out,"receivers: ");
  pbVar1 = (sig->receivers).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (sig->receivers).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    std::operator<<(out,(string *)pbVar4);
  }
  poVar2 = std::operator<<(out,"}");
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Signal& sig) {
	out << "Signal {name: " << sig.name << ", ";
	out << "Multiplexed: " << (sig.is_multiplexed ? "True" : "False") << ", ";
	out << "Start bit: " << sig.start_bit << ", ";
	out << "Size: " << sig.size << ", ";
	out << "Endianness: " << (sig.is_bigendian ? "Big endian" : "Little endian") << ", ";
	out << "Value Type: " << (sig.is_signed ? "Signed" : "Unsigned") << ", ";
	out << "Min: " << sig.min << ", Max: " << sig.max << ", ";
	out << "Unit: (" << sig.unit << "), ";
	out << "receivers: ";
	for (const auto& reciever : sig.receivers) {
		out << reciever;
	}
	return out << "}";
}